

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::AttributeLocationTestUtil::Attribute::Attribute
          (Attribute *this,AttribType *type,string *name,deInt32 layoutLocation,Cond *cond,
          int arraySize)

{
  int arraySize_local;
  Cond *cond_local;
  deInt32 layoutLocation_local;
  string *name_local;
  AttribType *type_local;
  Attribute *this_local;
  
  AttribType::AttribType(&this->m_type,type);
  std::__cxx11::string::string((string *)&this->m_name,(string *)name);
  this->m_layoutLocation = layoutLocation;
  Cond::Cond(&this->m_cond,cond);
  this->m_arraySize = arraySize;
  return;
}

Assistant:

Attribute::Attribute (const AttribType& type, const string& name, deInt32 layoutLocation, const Cond& cond, int arraySize)
	: m_type			(type)
	, m_name			(name)
	, m_layoutLocation	(layoutLocation)
	, m_cond			(cond)
	, m_arraySize		(arraySize)
{
}